

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void __thiscall CaDiCaL::Solver::disconnect_learner(Solver *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  FILE *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  External *pEVar18;
  Internal *pIVar19;
  File *file;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *in_RCX;
  Solver *pSVar20;
  CaDiCaL *file_name;
  bool antecedents;
  bool antecedents_00;
  bool antecedents_01;
  bool antecedents_02;
  Internal *this_00;
  Solver *pSVar21;
  Solver *pSVar22;
  CaDiCaL *this_01;
  undefined1 print;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  Internal *pIVar26;
  External *pEVar27;
  undefined1 *this_02;
  bool bVar28;
  bool bVar29;
  
  pcVar23 = "void CaDiCaL::Solver::disconnect_learner()";
  pIVar19 = (Internal *)this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"void CaDiCaL::Solver::disconnect_learner()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (this->external == (External *)0x0) {
    disconnect_learner();
LAB_0083daf1:
    disconnect_learner();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0083daf1;
    if ((this->_state & VALID) != 0) {
      this->external->learner = (Learner *)0x0;
      return;
    }
  }
  disconnect_learner();
  pIVar26 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,
             "void CaDiCaL::Solver::connect_fixed_listener(FixedAssignmentListener *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  pEVar18 = *(External **)&pIVar19->external_prop_is_lazy;
  if (pEVar18 == (External *)0x0) {
    connect_fixed_listener();
LAB_0083db5f:
    connect_fixed_listener();
LAB_0083db64:
    connect_fixed_listener();
  }
  else {
    if (*(Internal **)&pIVar19->preprocessing == (Internal *)0x0) goto LAB_0083db5f;
    if ((pIVar19->unsat & VALID) == 0) goto LAB_0083db64;
    if ((FixedAssignmentListener *)pcVar23 != (FixedAssignmentListener *)0x0) {
      if (pEVar18->fixed_listener != (FixedAssignmentListener *)0x0) {
        disconnect_fixed_listener((Solver *)pIVar19);
        pEVar18 = *(External **)&pIVar19->external_prop_is_lazy;
      }
      pEVar18->fixed_listener = (FixedAssignmentListener *)pcVar23;
      return;
    }
  }
  connect_fixed_listener();
  pcVar23 = "void CaDiCaL::Solver::disconnect_fixed_listener()";
  pIVar19 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,"void CaDiCaL::Solver::disconnect_fixed_listener()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (*(External **)&pIVar26->external_prop_is_lazy == (External *)0x0) {
    disconnect_fixed_listener();
LAB_0083dbad:
    disconnect_fixed_listener();
  }
  else {
    if (*(Internal **)&pIVar26->preprocessing == (Internal *)0x0) goto LAB_0083dbad;
    if ((pIVar26->unsat & VALID) != 0) {
      (*(External **)&pIVar26->external_prop_is_lazy)->fixed_listener =
           (FixedAssignmentListener *)0x0;
      return;
    }
  }
  disconnect_fixed_listener();
  pIVar26 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,
             "void CaDiCaL::Solver::connect_external_propagator(ExternalPropagator *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  pEVar18 = *(External **)&pIVar19->external_prop_is_lazy;
  if (pEVar18 == (External *)0x0) {
    connect_external_propagator();
LAB_0083dc34:
    connect_external_propagator();
LAB_0083dc39:
    connect_external_propagator();
  }
  else {
    pIVar26 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar26 == (Internal *)0x0) goto LAB_0083dc34;
    if ((pIVar19->unsat & 0x6eU) == 0) goto LAB_0083dc39;
    if ((ExternalPropagator *)pcVar23 != (ExternalPropagator *)0x0) {
      if (pEVar18->propagator != (ExternalPropagator *)0x0) {
        disconnect_external_propagator((Solver *)pIVar19);
        pIVar26 = *(Internal **)&pIVar19->preprocessing;
        pEVar18 = *(External **)&pIVar19->external_prop_is_lazy;
      }
      pEVar18->propagator = (ExternalPropagator *)pcVar23;
      Internal::connect_propagator(pIVar26);
      lVar4 = *(long *)&pIVar19->preprocessing;
      *(undefined1 *)(lVar4 + 0xe) = 1;
      *(ExternalPropagator *)(lVar4 + 0x10) = ((ExternalPropagator *)pcVar23)[8];
      return;
    }
  }
  connect_external_propagator();
  pcVar23 = "void CaDiCaL::Solver::disconnect_external_propagator()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,"void CaDiCaL::Solver::disconnect_external_propagator()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  pEVar18 = *(External **)&pIVar26->external_prop_is_lazy;
  if (pEVar18 == (External *)0x0) {
    disconnect_external_propagator();
LAB_0083dcb0:
    disconnect_external_propagator();
  }
  else {
    pIVar19 = *(Internal **)&pIVar26->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0083dcb0;
    if ((pIVar26->unsat & VALID) != 0) {
      if (pEVar18->propagator != (ExternalPropagator *)0x0) {
        External::reset_observed_vars(pEVar18);
        pIVar19 = *(Internal **)&pIVar26->preprocessing;
        pEVar18 = *(External **)&pIVar26->external_prop_is_lazy;
      }
      pEVar18->propagator = (ExternalPropagator *)0x0;
      Internal::set_tainted_literal(pIVar19);
      pIVar19 = *(Internal **)&pIVar26->preprocessing;
      pIVar19->external_prop = false;
      pIVar19->external_prop_is_lazy = true;
      return;
    }
  }
  disconnect_external_propagator();
  pSVar21 = (Solver *)((ulong)pcVar23 & 0xffffffff);
  bVar28 = *(long *)&pEVar18->max_var == 0;
  pFVar5 = *(FILE **)&(pEVar18->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar20 = (Solver *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    pSVar20 = pSVar21;
    fprintf(pFVar5,"%s %d\n","observe");
    fflush(*(FILE **)&(pEVar18->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar24 = "void CaDiCaL::Solver::add_observed_var(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar18,"void CaDiCaL::Solver::add_observed_var(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar20->adding_clause);
  if ((External *)pEVar18->vsize == (External *)0x0) {
    add_observed_var();
LAB_0083dd41:
    add_observed_var();
LAB_0083dd46:
    add_observed_var();
  }
  else {
    if (*(long *)&pEVar18->max_var == 0) goto LAB_0083dd41;
    if (((ulong)pEVar18->internal & 0x7e00000000) == 0) goto LAB_0083dd46;
    if (((ulong)pcVar23 & 0x7fffffff) != 0) {
      External::add_observed_var((External *)pEVar18->vsize,(int)pcVar23);
      return;
    }
  }
  add_observed_var(pSVar21);
  pSVar22 = (Solver *)((ulong)pcVar24 & 0xffffffff);
  bVar28 = pSVar21->internal == (Internal *)0x0;
  pFVar5 = (FILE *)pSVar21->trace_api_file;
  pSVar20 = (Solver *)CONCAT71((int7)((ulong)pSVar20 >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    pSVar20 = pSVar22;
    fprintf(pFVar5,"%s %d\n","unobserve");
    fflush((FILE *)pSVar21->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar21,"void CaDiCaL::Solver::remove_observed_var(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar20->adding_clause);
  if (pSVar21->external == (External *)0x0) {
    remove_observed_var();
LAB_0083ddd9:
    remove_observed_var();
LAB_0083ddde:
    remove_observed_var();
  }
  else {
    if (pSVar21->internal == (Internal *)0x0) goto LAB_0083ddd9;
    if ((pSVar21->_state & VALID) == 0) goto LAB_0083ddde;
    if (((ulong)pcVar24 & 0x7fffffff) != 0) {
      External::remove_observed_var(pSVar21->external,(int)pcVar24);
      return;
    }
  }
  remove_observed_var(pSVar22);
  bVar28 = pSVar22->internal == (Internal *)0x0;
  pFVar5 = (FILE *)pSVar22->trace_api_file;
  pcVar23 = (char *)CONCAT71((int7)((ulong)pSVar20 >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    fprintf(pFVar5,"%s\n","reset_observed_vars");
    fflush((FILE *)pSVar22->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar22,"void CaDiCaL::Solver::reset_observed_vars()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  pEVar18 = pSVar22->external;
  if (pEVar18 == (External *)0x0) {
    reset_observed_vars();
LAB_0083de59:
    reset_observed_vars();
  }
  else {
    if (pSVar22->internal == (Internal *)0x0) goto LAB_0083de59;
    if ((pSVar22->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
      External::reset_observed_vars(pEVar18);
      return;
    }
  }
  reset_observed_vars();
  bVar28 = *(long *)&pEVar18->max_var == 0;
  pFVar5 = *(FILE **)&(pEVar18->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar23 = (char *)CONCAT71((int7)((ulong)pcVar23 >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    fprintf(pFVar5,"%s\n","active");
    fflush(*(FILE **)&(pEVar18->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar27 = pEVar18;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar18,"int CaDiCaL::Solver::active() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  if (pEVar18->vsize == 0) {
    active();
LAB_0083ded5:
    active();
  }
  else {
    if (*(long *)&pEVar18->max_var == 0) goto LAB_0083ded5;
    if (((ulong)pEVar18->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  active();
  bVar28 = *(long *)&pEVar27->max_var == 0;
  pFVar5 = *(FILE **)&(pEVar27->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar23 = (char *)CONCAT71((int7)((ulong)pcVar23 >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    fprintf(pFVar5,"%s\n","redundant");
    fflush(*(FILE **)&(pEVar27->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar18 = pEVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar27,"int64_t CaDiCaL::Solver::redundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  if (pEVar27->vsize == 0) {
    redundant();
LAB_0083df52:
    redundant();
  }
  else {
    if (*(long *)&pEVar27->max_var == 0) goto LAB_0083df52;
    if (((ulong)pEVar27->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  redundant();
  bVar28 = *(long *)&pEVar18->max_var == 0;
  pFVar5 = *(FILE **)&(pEVar18->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar23 = (char *)CONCAT71((int7)((ulong)pcVar23 >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    fprintf(pFVar5,"%s\n","irredundant");
    fflush(*(FILE **)&(pEVar18->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar24 = "int64_t CaDiCaL::Solver::irredundant() const";
  pEVar27 = pEVar18;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar18,"int64_t CaDiCaL::Solver::irredundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  if (pEVar18->vsize == 0) {
    irredundant();
LAB_0083dfce:
    irredundant();
  }
  else {
    if (*(long *)&pEVar18->max_var == 0) goto LAB_0083dfce;
    if (((ulong)pEVar18->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  irredundant();
  pSVar21 = (Solver *)((ulong)pcVar24 & 0xffffffff);
  bVar28 = *(long *)&pEVar27->max_var == 0;
  pFVar5 = *(FILE **)&(pEVar27->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar20 = (Solver *)CONCAT71((int7)((ulong)pcVar23 >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    pSVar20 = pSVar21;
    fprintf(pFVar5,"%s %d\n","freeze");
    fflush(*(FILE **)&(pEVar27->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar23 = "void CaDiCaL::Solver::freeze(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar27,"void CaDiCaL::Solver::freeze(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar20->adding_clause);
  if ((External *)pEVar27->vsize == (External *)0x0) {
    freeze();
LAB_0083e05f:
    freeze();
LAB_0083e064:
    freeze();
  }
  else {
    if (*(long *)&pEVar27->max_var == 0) goto LAB_0083e05f;
    if (((ulong)pEVar27->internal & 0x6e00000000) == 0) goto LAB_0083e064;
    if (((ulong)pcVar24 & 0x7fffffff) != 0) {
      External::freeze((External *)pEVar27->vsize,(int)pcVar24);
      return;
    }
  }
  freeze(pSVar21);
  pSVar22 = (Solver *)((ulong)pcVar23 & 0xffffffff);
  bVar28 = pSVar21->internal == (Internal *)0x0;
  pFVar5 = (FILE *)pSVar21->trace_api_file;
  pSVar20 = (Solver *)CONCAT71((int7)((ulong)pSVar20 >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    pSVar20 = pSVar22;
    fprintf(pFVar5,"%s %d\n","melt");
    fflush((FILE *)pSVar21->trace_api_file);
  }
  pcVar24 = "void CaDiCaL::Solver::melt(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar21,"void CaDiCaL::Solver::melt(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar20->adding_clause);
  pEVar18 = pSVar21->external;
  if (pEVar18 == (External *)0x0) {
LAB_0083e126:
    melt();
LAB_0083e12b:
    melt();
LAB_0083e130:
    melt();
  }
  else {
    if (pSVar21->internal == (Internal *)0x0) goto LAB_0083e12b;
    if ((pSVar21->_state & VALID) == 0) goto LAB_0083e130;
    if (((ulong)pcVar23 & 0x7fffffff) != 0) {
      uVar16 = (uint)pcVar23;
      uVar17 = -uVar16;
      if (0 < (int)uVar16) {
        uVar17 = uVar16;
      }
      if ((((int)uVar17 <= pEVar18->max_var) &&
          (pSVar20 = (Solver *)
                     (pEVar18->frozentab).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
          (int)uVar17 <
          (int)((ulong)((long)(pEVar18->frozentab).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar20) >> 2))) &&
         (*(int *)(&pSVar20->adding_clause + (ulong)uVar17 * 4) != 0)) {
        External::melt(pEVar18,uVar16);
        return;
      }
      melt(pSVar22);
      goto LAB_0083e126;
    }
  }
  melt(pSVar22);
  this_01 = (CaDiCaL *)((ulong)pcVar24 & 0xffffffff);
  bVar28 = pSVar22->internal == (Internal *)0x0;
  pFVar5 = (FILE *)pSVar22->trace_api_file;
  file_name = (CaDiCaL *)CONCAT71((int7)((ulong)pSVar20 >> 8),pFVar5 == (FILE *)0x0 || bVar28);
  if (pFVar5 != (FILE *)0x0 && !bVar28) {
    file_name = this_01;
    fprintf(pFVar5,"%s %d\n","frozen");
    fflush((FILE *)pSVar22->trace_api_file);
  }
  pcVar23 = "bool CaDiCaL::Solver::frozen(int) const";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar22,"bool CaDiCaL::Solver::frozen(int) const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)file_name);
  if (pSVar22->external == (External *)0x0) {
    frozen();
LAB_0083e1ef:
    frozen();
LAB_0083e1f4:
    frozen();
  }
  else {
    if (pSVar22->internal == (Internal *)0x0) goto LAB_0083e1ef;
    if ((pSVar22->_state & VALID) == 0) goto LAB_0083e1f4;
    if (((ulong)pcVar24 & 0x7fffffff) != 0) {
      return;
    }
  }
  frozen();
  pFVar5 = *(FILE **)(this_01 + 0x20);
  pIVar19 = (Internal *)
            CONCAT71((int7)((ulong)file_name >> 8),
                     pFVar5 == (FILE *)0x0 || *(long *)(this_01 + 8) == 0);
  if (pFVar5 != (FILE *)0x0 && *(long *)(this_01 + 8) != 0) {
    pIVar19 = this_00;
    fprintf(pFVar5,"%s %s\n","trace_proof");
    fflush(*(FILE **)(this_01 + 0x20));
  }
  print = 0x90;
  require_solver_pointer_to_be_non_zero
            (this_01,"bool CaDiCaL::Solver::trace_proof(FILE *, const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pIVar19);
  if (*(long *)(this_01 + 0x10) == 0) {
    trace_proof();
LAB_0083e29c:
    trace_proof();
LAB_0083e2a1:
    trace_proof();
  }
  else {
    if (*(long *)(this_01 + 8) == 0) goto LAB_0083e29c;
    if ((*(uint *)(this_01 + 4) & 0x6e) == 0) goto LAB_0083e2a1;
    if (*(uint *)(this_01 + 4) == 2) {
      file = (File *)File::write((int)*(long *)(this_01 + 8),pcVar23,(size_t)this_00);
      Internal::trace(*(Internal **)(this_01 + 8),file);
      return;
    }
  }
  pIVar26 = this_00;
  trace_proof((Solver *)this_00);
  lVar4._0_1_ = pIVar26->preprocessing;
  lVar4._1_1_ = pIVar26->protected_reasons;
  lVar4._2_1_ = pIVar26->force_saved_phase;
  lVar4._3_1_ = pIVar26->searching_lucky_phases;
  lVar4._4_1_ = pIVar26->stable;
  lVar4._5_1_ = pIVar26->reported;
  lVar4._6_1_ = pIVar26->external_prop;
  lVar4._7_1_ = pIVar26->did_external_prop;
  pFVar5 = (FILE *)(pIVar26->reluctant).v;
  pcVar23 = (char *)CONCAT71((int7)((ulong)pIVar19 >> 8),pFVar5 == (FILE *)0x0 || lVar4 == 0);
  if (pFVar5 != (FILE *)0x0 && lVar4 != 0) {
    fprintf(pFVar5,"%s\n","close_proof_trace");
    fflush((FILE *)(pIVar26->reluctant).v);
  }
  pcVar24 = "void CaDiCaL::Solver::close_proof_trace(bool)";
  pIVar19 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,"void CaDiCaL::Solver::close_proof_trace(bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  lVar6._0_1_ = pIVar26->external_prop_is_lazy;
  lVar6._1_1_ = pIVar26->forced_backt_allowed;
  lVar6._2_1_ = pIVar26->private_steps;
  lVar6._3_1_ = pIVar26->rephased;
  lVar6._4_4_ = *(undefined4 *)&pIVar26->field_0x14;
  if (lVar6 == 0) {
    close_proof_trace();
LAB_0083e351:
    close_proof_trace();
LAB_0083e356:
    close_proof_trace();
LAB_0083e35b:
    close_proof_trace();
  }
  else {
    lVar4 = *(long *)&pIVar26->preprocessing;
    if (lVar4 == 0) goto LAB_0083e351;
    if ((pIVar26->unsat & 0x6eU) == 0) goto LAB_0083e356;
    pcVar23 = *(char **)(lVar4 + 0xc50);
    if (*(char **)(lVar4 + 0xc48) == pcVar23) goto LAB_0083e35b;
    pIVar19 = *(Internal **)(pcVar23 + -8);
    cVar15 = (**(code **)(*(long *)pIVar19 + 0x98))();
    if (cVar15 == '\0') {
      Internal::close_trace(*(Internal **)&pIVar26->preprocessing,(bool)print);
      return;
    }
  }
  close_proof_trace();
  bVar28 = SUB81(pcVar23,0);
  pcVar25 = "void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)";
  pIVar26 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  lVar7._0_1_ = pIVar19->external_prop_is_lazy;
  lVar7._1_1_ = pIVar19->forced_backt_allowed;
  lVar7._2_1_ = pIVar19->private_steps;
  lVar7._3_1_ = pIVar19->rephased;
  lVar7._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar7 == 0) {
    connect_proof_tracer();
LAB_0083e3cc:
    connect_proof_tracer();
LAB_0083e3d1:
    connect_proof_tracer();
LAB_0083e3d6:
    connect_proof_tracer();
  }
  else {
    pIVar26 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar26 == (Internal *)0x0) goto LAB_0083e3cc;
    uVar17._0_1_ = pIVar19->unsat;
    uVar17._1_1_ = pIVar19->iterating;
    uVar17._2_1_ = pIVar19->localsearching;
    uVar17._3_1_ = pIVar19->lookingahead;
    if ((uVar17 & 0x6e) == 0) goto LAB_0083e3d1;
    if (uVar17 != 2) goto LAB_0083e3d6;
    if ((Tracer *)pcVar24 != (Tracer *)0x0) {
      Internal::connect_proof_tracer(pIVar26,(Tracer *)pcVar24,antecedents,bVar28);
      return;
    }
  }
  connect_proof_tracer();
  bVar28 = SUB81(pcVar23,0);
  pcVar24 = "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)";
  pIVar19 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,
             "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  lVar8._0_1_ = pIVar26->external_prop_is_lazy;
  lVar8._1_1_ = pIVar26->forced_backt_allowed;
  lVar8._2_1_ = pIVar26->private_steps;
  lVar8._3_1_ = pIVar26->rephased;
  lVar8._4_4_ = *(undefined4 *)&pIVar26->field_0x14;
  if (lVar8 == 0) {
    connect_proof_tracer();
LAB_0083e446:
    connect_proof_tracer();
LAB_0083e44b:
    connect_proof_tracer();
LAB_0083e450:
    connect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar26->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0083e446;
    uVar16._0_1_ = pIVar26->unsat;
    uVar16._1_1_ = pIVar26->iterating;
    uVar16._2_1_ = pIVar26->localsearching;
    uVar16._3_1_ = pIVar26->lookingahead;
    if ((uVar16 & 0x6e) == 0) goto LAB_0083e44b;
    if (uVar16 != 2) goto LAB_0083e450;
    if ((InternalTracer *)pcVar25 != (InternalTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar19,(InternalTracer *)pcVar25,antecedents_00,bVar28);
      return;
    }
  }
  connect_proof_tracer();
  bVar28 = SUB81(pcVar23,0);
  pcVar25 = "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)";
  pIVar26 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,
             "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  lVar9._0_1_ = pIVar19->external_prop_is_lazy;
  lVar9._1_1_ = pIVar19->forced_backt_allowed;
  lVar9._2_1_ = pIVar19->private_steps;
  lVar9._3_1_ = pIVar19->rephased;
  lVar9._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar9 == 0) {
    connect_proof_tracer();
LAB_0083e4c0:
    connect_proof_tracer();
LAB_0083e4c5:
    connect_proof_tracer();
LAB_0083e4ca:
    connect_proof_tracer();
  }
  else {
    pIVar26 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar26 == (Internal *)0x0) goto LAB_0083e4c0;
    uVar1._0_1_ = pIVar19->unsat;
    uVar1._1_1_ = pIVar19->iterating;
    uVar1._2_1_ = pIVar19->localsearching;
    uVar1._3_1_ = pIVar19->lookingahead;
    if ((uVar1 & 0x6e) == 0) goto LAB_0083e4c5;
    if (uVar1 != 2) goto LAB_0083e4ca;
    if ((StatTracer *)pcVar24 != (StatTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar26,(StatTracer *)pcVar24,antecedents_01,bVar28);
      return;
    }
  }
  connect_proof_tracer();
  bVar28 = SUB81(pcVar23,0);
  pcVar24 = "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)";
  pIVar19 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,
             "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  lVar10._0_1_ = pIVar26->external_prop_is_lazy;
  lVar10._1_1_ = pIVar26->forced_backt_allowed;
  lVar10._2_1_ = pIVar26->private_steps;
  lVar10._3_1_ = pIVar26->rephased;
  lVar10._4_4_ = *(undefined4 *)&pIVar26->field_0x14;
  if (lVar10 == 0) {
    connect_proof_tracer();
LAB_0083e53a:
    connect_proof_tracer();
LAB_0083e53f:
    connect_proof_tracer();
LAB_0083e544:
    connect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar26->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0083e53a;
    uVar2._0_1_ = pIVar26->unsat;
    uVar2._1_1_ = pIVar26->iterating;
    uVar2._2_1_ = pIVar26->localsearching;
    uVar2._3_1_ = pIVar26->lookingahead;
    if ((uVar2 & 0x6e) == 0) goto LAB_0083e53f;
    if (uVar2 != 2) goto LAB_0083e544;
    if ((FileTracer *)pcVar25 != (FileTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar19,(FileTracer *)pcVar25,antecedents_02,bVar28);
      return;
    }
  }
  connect_proof_tracer();
  pcVar25 = "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)";
  pIVar26 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  lVar11._0_1_ = pIVar19->external_prop_is_lazy;
  lVar11._1_1_ = pIVar19->forced_backt_allowed;
  lVar11._2_1_ = pIVar19->private_steps;
  lVar11._3_1_ = pIVar19->rephased;
  lVar11._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar11 == 0) {
    disconnect_proof_tracer();
LAB_0083e59b:
    disconnect_proof_tracer();
LAB_0083e5a0:
    disconnect_proof_tracer();
  }
  else {
    pIVar26 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar26 == (Internal *)0x0) goto LAB_0083e59b;
    if ((pIVar19->unsat & 0x6eU) == 0) goto LAB_0083e5a0;
    if ((Tracer *)pcVar24 != (Tracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar26,(Tracer *)pcVar24);
      return;
    }
  }
  disconnect_proof_tracer();
  pcVar24 = "bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)";
  pIVar19 = pIVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,"bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  lVar12._0_1_ = pIVar26->external_prop_is_lazy;
  lVar12._1_1_ = pIVar26->forced_backt_allowed;
  lVar12._2_1_ = pIVar26->private_steps;
  lVar12._3_1_ = pIVar26->rephased;
  lVar12._4_4_ = *(undefined4 *)&pIVar26->field_0x14;
  if (lVar12 == 0) {
    disconnect_proof_tracer();
LAB_0083e5f7:
    disconnect_proof_tracer();
LAB_0083e5fc:
    disconnect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar26->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0083e5f7;
    if ((pIVar26->unsat & 0x6eU) == 0) goto LAB_0083e5fc;
    if ((StatTracer *)pcVar25 != (StatTracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar19,(StatTracer *)pcVar25);
      return;
    }
  }
  disconnect_proof_tracer();
  pIVar26 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"bool CaDiCaL::Solver::disconnect_proof_tracer(FileTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  lVar13._0_1_ = pIVar19->external_prop_is_lazy;
  lVar13._1_1_ = pIVar19->forced_backt_allowed;
  lVar13._2_1_ = pIVar19->private_steps;
  lVar13._3_1_ = pIVar19->rephased;
  lVar13._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar13 == 0) {
    disconnect_proof_tracer();
LAB_0083e653:
    disconnect_proof_tracer();
LAB_0083e658:
    disconnect_proof_tracer();
  }
  else {
    pIVar26 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar26 == (Internal *)0x0) goto LAB_0083e653;
    if ((pIVar19->unsat & 0x6eU) == 0) goto LAB_0083e658;
    if ((FileTracer *)pcVar24 != (FileTracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar26,(FileTracer *)pcVar24);
      return;
    }
  }
  disconnect_proof_tracer();
  lVar14._0_1_ = pIVar26->preprocessing;
  lVar14._1_1_ = pIVar26->protected_reasons;
  lVar14._2_1_ = pIVar26->force_saved_phase;
  lVar14._3_1_ = pIVar26->searching_lucky_phases;
  lVar14._4_1_ = pIVar26->stable;
  lVar14._5_1_ = pIVar26->reported;
  lVar14._6_1_ = pIVar26->external_prop;
  lVar14._7_1_ = pIVar26->did_external_prop;
  pFVar5 = (FILE *)(pIVar26->reluctant).v;
  pcVar23 = (char *)CONCAT71((int7)((ulong)pcVar23 >> 8),pFVar5 == (FILE *)0x0 || lVar14 == 0);
  if (pFVar5 != (FILE *)0x0 && lVar14 != 0) {
    fprintf(pFVar5,"%s\n","conclude");
    fflush((FILE *)(pIVar26->reluctant).v);
  }
  pcVar24 = "void CaDiCaL::Solver::conclude()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar26,"void CaDiCaL::Solver::conclude()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar23);
  pEVar18 = *(External **)&pIVar26->external_prop_is_lazy;
  if (pEVar18 == (External *)0x0) {
    conclude();
LAB_0083e6f3:
    conclude();
  }
  else {
    if (*(Internal **)&pIVar26->preprocessing == (Internal *)0x0) goto LAB_0083e6f3;
    uVar3._0_1_ = pIVar26->unsat;
    uVar3._1_1_ = pIVar26->iterating;
    uVar3._2_1_ = pIVar26->localsearching;
    uVar3._3_1_ = pIVar26->lookingahead;
    if ((uVar3 & 0x6e) != 0) {
      if (uVar3 == 4) {
        External::conclude_unknown(pEVar18);
        return;
      }
      if (uVar3 == 0x20) {
        External::conclude_sat(pEVar18);
        return;
      }
      if (uVar3 == 0x40) {
        Internal::conclude_unsat(*(Internal **)&pIVar26->preprocessing);
        return;
      }
      goto LAB_0083e6fd;
    }
  }
  conclude();
LAB_0083e6fd:
  conclude();
  bVar28 = _stderr != pEVar18;
  if (bVar28) {
    this_02 = (undefined1 *)0x0;
  }
  else {
    this_02 = terr;
  }
  bVar29 = _stdout == pEVar18;
  if (bVar29) {
    this_02 = tout;
  }
  pcVar23 = CaDiCaL::version();
  pcVar25 = identifier();
  __s = compiler();
  __s_00 = date();
  __s_01 = flags();
  fputs(pcVar24,(FILE *)pEVar18);
  if (bVar29 || !bVar28) {
    Terminal::color((Terminal *)this_02,0x23,false);
    fputs("Version ",(FILE *)pEVar18);
    Terminal::code((Terminal *)this_02,"0m");
    fputs(pcVar23,(FILE *)pEVar18);
    if (pcVar25 != (char *)0x0) {
      Terminal::color((Terminal *)this_02,0x23,false);
      fputc(0x20,(FILE *)pEVar18);
      fputs(pcVar25,(FILE *)pEVar18);
      Terminal::code((Terminal *)this_02,"0m");
    }
  }
  else {
    fputs("Version ",(FILE *)pEVar18);
    fputs(pcVar23,(FILE *)pEVar18);
    if (pcVar25 != (char *)0x0) {
      fputc(0x20,(FILE *)pEVar18);
      fputs(pcVar25,(FILE *)pEVar18);
    }
  }
  fputc(10,(FILE *)pEVar18);
  if (__s != (char *)0x0) {
    fputs(pcVar24,(FILE *)pEVar18);
    if (bVar29 || !bVar28) {
      Terminal::color((Terminal *)this_02,0x23,false);
    }
    fputs(__s,(FILE *)pEVar18);
    if (__s_01 != (char *)0x0) {
      fputc(0x20,(FILE *)pEVar18);
      fputs(__s_01,(FILE *)pEVar18);
    }
    if (bVar29 || !bVar28) {
      Terminal::code((Terminal *)this_02,"0m");
    }
    fputc(10,(FILE *)pEVar18);
  }
  if (__s_00 != (char *)0x0) {
    fputs(pcVar24,(FILE *)pEVar18);
    if (bVar29 || !bVar28) {
      Terminal::color((Terminal *)this_02,0x23,false);
      fputs(__s_00,(FILE *)pEVar18);
      Terminal::code((Terminal *)this_02,"0m");
    }
    else {
      fputs(__s_00,(FILE *)pEVar18);
    }
    fputc(10,(FILE *)pEVar18);
  }
  fflush((FILE *)pEVar18);
  return;
}

Assistant:

void Solver::disconnect_learner () {
  LOG_API_CALL_BEGIN ("disconnect_learner");
  REQUIRE_VALID_STATE ();
#ifdef LOGGING
  if (external->learner)
    LOG ("disconnecting previous learner");
  else
    LOG ("ignoring to disconnect learner (no previous one)");
#endif
  external->learner = 0;
  LOG_API_CALL_END ("disconnect_learner");
}